

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_preprocessor.c
# Opt level: O1

Define * find_macro_arg(IncludeState *state,Define *defines)

{
  uint uVar1;
  char *pcVar2;
  long lVar3;
  int iVar4;
  char *__s2;
  undefined8 uStack_30;
  char acStack_28 [8];
  
  uVar1 = state->tokenlen;
  lVar3 = -((ulong)(uVar1 + 1) + 0xf & 0xfffffffffffffff0);
  __s2 = acStack_28 + lVar3;
  pcVar2 = state->token;
  *(undefined8 *)((long)&uStack_30 + lVar3) = 0x1322b9;
  memcpy(__s2,pcVar2,(ulong)uVar1);
  __s2[uVar1] = '\0';
  while( true ) {
    if (defines == (Define *)0x0) {
      return (Define *)0x0;
    }
    if (defines->parameters != (char **)0x0) {
      *(undefined8 *)((long)&uStack_30 + lVar3) = 0x132312;
      __assert_fail("def->parameters == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                    ,0x1f9,"const Define *find_macro_arg(const IncludeState *, const Define *)");
    }
    if (defines->paramcount != 0) {
      *(undefined8 *)((long)&uStack_30 + lVar3) = 0x132331;
      __assert_fail("def->paramcount == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                    ,0x1fa,"const Define *find_macro_arg(const IncludeState *, const Define *)");
    }
    pcVar2 = defines->identifier;
    *(undefined8 *)((long)&uStack_30 + lVar3) = 0x1322db;
    iVar4 = strcmp(pcVar2,__s2);
    if (iVar4 == 0) break;
    defines = defines->next;
  }
  return defines;
}

Assistant:

static const Define *find_macro_arg(const IncludeState *state,
                                    const Define *defines)
{
    const Define *def = NULL;
    char *sym = (char *) alloca(state->tokenlen + 1);
    memcpy(sym, state->token, state->tokenlen);
    sym[state->tokenlen] = '\0';

    for (def = defines; def != NULL; def = def->next)
    {
        assert(def->parameters == NULL);  // args can't have args!
        assert(def->paramcount == 0);  // args can't have args!
        if (strcmp(def->identifier, sym) == 0)
            break;
    } // while

    return def;
}